

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  CreateExtkeyRequestStruct request;
  CreateExtkeyResponseStruct response;
  CreateExtkeyResponse res;
  CreateExtkeyRequest req;
  string local_3c8;
  CreateExtkeyRequestStruct local_3a8;
  CreateExtkeyResponseStruct local_2a8;
  ErrorResponse local_1e0;
  CreateExtkeyRequest local_128;
  
  CreateExtkeyRequest::CreateExtkeyRequest(&local_128);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyRequest>::Deserialize
            (&local_128.super_JsonClassBase<cfd::js::api::json::CreateExtkeyRequest>,(string *)this)
  ;
  CreateExtkeyRequest::ConvertToStruct(&local_3a8,&local_128);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_2a8,request_message,&local_3a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_2a8.error.code == 0) {
      CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)&local_1e0);
      CreateExtkeyResponse::ConvertFromStruct((CreateExtkeyResponse *)&local_1e0,&local_2a8);
      core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_
                (&local_3c8,(JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> *)&local_1e0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)&local_1e0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1e0,&local_2a8.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_3c8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1e0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      local_1e0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_1e0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1e0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2a8.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.error.message._M_dataplus._M_p != &local_2a8.error.message.field_2) {
      operator_delete(local_2a8.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.error.type._M_dataplus._M_p != &local_2a8.error.type.field_2) {
      operator_delete(local_2a8.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.extkey._M_dataplus._M_p != &local_2a8.extkey.field_2) {
      operator_delete(local_2a8.extkey._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_3a8.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.chain_code._M_dataplus._M_p != &local_3a8.chain_code.field_2) {
      operator_delete(local_3a8.chain_code._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.key._M_dataplus._M_p != &local_3a8.key.field_2) {
      operator_delete(local_3a8.key._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.parent_fingerprint._M_dataplus._M_p != &local_3a8.parent_fingerprint.field_2) {
      operator_delete(local_3a8.parent_fingerprint._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.parent_key._M_dataplus._M_p != &local_3a8.parent_key.field_2) {
      operator_delete(local_3a8.parent_key._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.extkey_type._M_dataplus._M_p != &local_3a8.extkey_type.field_2) {
      operator_delete(local_3a8.extkey_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.network._M_dataplus._M_p != &local_3a8.network.field_2) {
      operator_delete(local_3a8.network._M_dataplus._M_p);
    }
    CreateExtkeyRequest::~CreateExtkeyRequest(&local_128);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)&local_1e0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct(&local_2a8);
  CreateExtkeyRequestStruct::~CreateExtkeyRequestStruct(&local_3a8);
  CreateExtkeyRequest::~CreateExtkeyRequest(&local_128);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}